

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

IterRange<kj::_::BTreeImpl::Iterator> * __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
range<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4],char_const(&)[4]>
          (IterRange<kj::_::BTreeImpl::Iterator> *__return_storage_ptr__,
          TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,char (*begin) [4],char (*end) [4])

{
  Iterator b;
  Iterator e;
  SearchKeyImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:1526:22)>
  local_a0;
  Iterator local_80;
  SearchKeyImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:1526:22)>
  local_68;
  Iterator local_48;
  char (*local_30) [4];
  char (*end_local) [4];
  char (*begin_local) [4];
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_local;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table_local;
  
  table_local.ptr = (StringPtr *)table.size_;
  this_local = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)table.ptr;
  local_30 = end;
  end_local = begin;
  begin_local = (char (*) [4])this;
  searchKey<kj::TreeMap<kj::String,int>::Entry,char_const[4]>
            (&local_68,this,(ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> *)&this_local,begin);
  _::BTreeImpl::search(&local_48,(BTreeImpl *)(this + 8),&local_68.super_SearchKey);
  searchKey<kj::TreeMap<kj::String,int>::Entry,char_const[4]>
            (&local_a0,this,(ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> *)&this_local,local_30);
  _::BTreeImpl::search(&local_80,(BTreeImpl *)(this + 8),&local_a0.super_SearchKey);
  b.leaf = local_48.leaf;
  b.tree = local_48.tree;
  b.row = local_48.row;
  b._20_4_ = local_48._20_4_;
  e.leaf = local_80.leaf;
  e.tree = local_80.tree;
  e.row = local_80.row;
  e._20_4_ = local_80._20_4_;
  _::IterRange<kj::_::BTreeImpl::Iterator>::IterRange(__return_storage_ptr__,b,e);
  return __return_storage_ptr__;
}

Assistant:

_::IterRange<_::BTreeImpl::Iterator> range(
      kj::ArrayPtr<Row> table, Begin&& begin, End&& end) const {
    return {
      impl.search(searchKey(table, begin)),
      impl.search(searchKey(table, end  ))
    };
  }